

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

bool __thiscall
Lowerer::GenerateFastEqBoolInt(Lowerer *this,Instr *instr,bool *pNeedHelper,bool isInHelper)

{
  code *pcVar1;
  bool *pbVar2;
  bool bVar3;
  bool bVar4;
  short sVar5;
  LibraryValue LVar6;
  undefined4 *puVar7;
  BranchInstr *pBVar8;
  Opnd *pOVar9;
  Opnd *pOVar10;
  LabelInstr *pLVar11;
  LabelInstr *pLVar12;
  RegOpnd *pRVar13;
  IntConstOpnd *pIVar14;
  LibraryValue local_2ec;
  LibraryValue local_2cc;
  LabelInstr *local_2a8;
  LabelInstr *local_288;
  LabelInstr *local_1c8;
  LibraryValue local_19c;
  LabelInstr *local_188;
  LabelInstr *local_178;
  LabelInstr *local_158;
  LabelInstr *local_150;
  byte local_139;
  byte local_130;
  bool local_12f;
  bool local_12e;
  bool local_12d;
  LabelInstr *isZero;
  LabelInstr *isNonZero;
  bool directPassthrough;
  LibraryValue intval;
  LabelInstr *forceInequal;
  LabelInstr *firstFalse;
  LabelInstr *target;
  bool sameVal;
  LabelInstr *inequalResultTarget;
  LabelInstr *equalResultTarget;
  LibraryValue inequalResultValue;
  LibraryValue equalResultValue;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_c8;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_c6;
  int32 local_c4;
  AddrOpnd *pAStack_c0;
  int32 value;
  AddrOpnd *addrSrcBool;
  IntConstType constIntVal_2;
  IntConstOpnd *constSrcBool;
  AddrOpnd *pAStack_a0;
  int32 constIntVal_1;
  AddrOpnd *addrSrcInt;
  IntConstType constIntVal;
  IntConstOpnd *constSrcInt;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_80;
  anon_union_2_4_ea848c7b_for_ValueType_13 aStack_7e;
  bool srcBoolConstVal;
  bool srcBoolConst;
  bool srcIntIsBoolable;
  bool srcIntConstVal;
  bool srcIntConst;
  LabelInstr *local_78;
  Opnd *srcInt;
  Opnd *srcBool;
  LabelInstr *labelDone;
  LabelInstr *labelHelper;
  BranchInstr *instrBranch;
  LabelInstr *labelFallthrough;
  LabelInstr *targetInstr;
  Opnd *src2;
  Opnd *src1;
  bool isNegOp;
  bool isStrict;
  bool isBranchNotCompare;
  bool *pbStack_28;
  bool isInHelper_local;
  bool *pNeedHelper_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  src1._7_1_ = isInHelper;
  pbStack_28 = pNeedHelper;
  pNeedHelper_local = (bool *)instr;
  instr_local = (Instr *)this;
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5bce,"(instr)","instr");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  src1._6_1_ = IR::Instr::IsBranchInstr((Instr *)pNeedHelper_local);
  src1._5_1_ = 0;
  sVar5 = (short)*(undefined4 *)(pNeedHelper_local + 0x30);
  if ((((ushort)(sVar5 - 0x14U) < 2) || ((ushort)(sVar5 - 0x41U) < 2)) ||
     (sVar5 == 0x196 || sVar5 == 0x197)) {
    src1._5_1_ = 1;
  }
  sVar5 = *(short *)(pNeedHelper_local + 0x30);
  if (sVar5 != 0xc) {
    if (sVar5 == 0xd) {
LAB_007ce053:
      src1._4_1_ = 1;
      goto LAB_007ce062;
    }
    if (sVar5 != 0x14) {
      if (sVar5 == 0x15) goto LAB_007ce053;
      if (sVar5 != 0x3b) {
        if (sVar5 == 0x40) goto LAB_007ce053;
        if (sVar5 != 0x41) {
          if ((sVar5 == 0x42) || (sVar5 == 0x194)) goto LAB_007ce053;
          if (sVar5 != 0x195) {
            if (sVar5 == 0x196) goto LAB_007ce053;
            if (sVar5 != 0x197) {
              return false;
            }
          }
        }
      }
    }
  }
  src1._4_1_ = 0;
LAB_007ce062:
  src2 = IR::Instr::GetSrc1((Instr *)pNeedHelper_local);
  targetInstr = (LabelInstr *)IR::Instr::GetSrc2((Instr *)pNeedHelper_local);
  if ((src2 == (Opnd *)0x0) || (targetInstr == (LabelInstr *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5bfe,"(src1 && src2)","src1 && src2");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if ((src2 != (Opnd *)0x0) && (targetInstr != (LabelInstr *)0x0)) {
    labelFallthrough = (LabelInstr *)0x0;
    instrBranch = (BranchInstr *)0x0;
    if ((src1._6_1_ & 1) != 0) {
      labelHelper = (LabelInstr *)IR::Instr::AsBranchInstr((Instr *)pNeedHelper_local);
      labelFallthrough = IR::BranchInstr::GetTarget((BranchInstr *)labelHelper);
      instrBranch = (BranchInstr *)
                    IR::Instr::GetOrCreateContinueLabel
                              (&labelHelper->super_Instr,(bool)(src1._7_1_ & 1));
    }
    *pbStack_28 = true;
    labelDone = (LabelInstr *)0x0;
    srcBool = (Opnd *)IR::Instr::GetOrCreateContinueLabel
                                ((Instr *)pNeedHelper_local,(bool)(src1._7_1_ & 1));
    srcInt = (Opnd *)0x0;
    local_78 = (LabelInstr *)0x0;
    _srcIntConstVal =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         IR::Opnd::GetValueType(src2);
    bVar3 = ValueType::IsLikelyBoolean((ValueType *)&srcIntConstVal);
    local_12d = false;
    if (bVar3) {
      _srcBoolConst =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           IR::Opnd::GetValueType((Opnd *)targetInstr);
      local_12d = ValueType::IsLikelyTaggedInt((ValueType *)&srcBoolConst);
    }
    if (local_12d == false) {
      aStack_7e.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           IR::Opnd::GetValueType(src2);
      bVar3 = ValueType::IsLikelyTaggedInt((ValueType *)&stack0xffffffffffffff82);
      local_12e = false;
      if (bVar3) {
        local_80.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             IR::Opnd::GetValueType((Opnd *)targetInstr);
        local_12e = ValueType::IsLikelyBoolean((ValueType *)&local_80.field_0);
      }
      if (local_12e == false) {
        return false;
      }
      local_78 = (LabelInstr *)src2;
      srcInt = (Opnd *)targetInstr;
    }
    else {
      srcInt = src2;
      local_78 = targetInstr;
    }
    constSrcInt._7_1_ = 0;
    constSrcInt._6_1_ = 0;
    constSrcInt._5_1_ = 0;
    constSrcInt._4_1_ = 0;
    constSrcInt._3_1_ = 0;
    bVar3 = IR::Opnd::IsIntConstOpnd((Opnd *)local_78);
    if (bVar3) {
      constIntVal = (IntConstType)IR::Opnd::AsIntConstOpnd((Opnd *)local_78);
      addrSrcInt = (AddrOpnd *)
                   IR::EncodableOpnd<long>::GetValue
                             (&((IntConstOpnd *)constIntVal)->super_EncodableOpnd<long>);
      constSrcInt._7_1_ = 1;
      if (addrSrcInt == (AddrOpnd *)0x0) {
        constSrcInt._6_1_ = 0;
        constSrcInt._5_1_ = 1;
      }
      else if (addrSrcInt == (AddrOpnd *)&DAT_00000001) {
        constSrcInt._6_1_ = 1;
        constSrcInt._5_1_ = 1;
      }
    }
    else {
      bVar3 = IR::Opnd::IsAddrOpnd((Opnd *)local_78);
      if (bVar3) {
        pAStack_a0 = IR::Opnd::AsAddrOpnd((Opnd *)local_78);
        if (((pAStack_a0 == (AddrOpnd *)0x0) || (bVar3 = IR::AddrOpnd::IsVar(pAStack_a0), !bVar3))
           || (bVar3 = Js::TaggedInt::Is(pAStack_a0->m_address), !bVar3)) {
          return false;
        }
        constSrcBool._4_4_ = Js::TaggedInt::ToInt32(pAStack_a0->m_address);
        constSrcInt._7_1_ = 1;
        if (constSrcBool._4_4_ == 0) {
          constSrcInt._6_1_ = 0;
          constSrcInt._5_1_ = 1;
        }
        else if (constSrcBool._4_4_ == 1) {
          constSrcInt._6_1_ = 1;
          constSrcInt._5_1_ = 1;
        }
      }
      else {
        bVar3 = IR::Opnd::IsConstOpnd((Opnd *)local_78);
        if (bVar3) {
          return false;
        }
      }
    }
    bVar3 = IR::Opnd::IsIntConstOpnd(srcInt);
    if (bVar3) {
      constIntVal_2 = (IntConstType)IR::Opnd::AsIntConstOpnd(srcInt);
      addrSrcBool = (AddrOpnd *)
                    IR::EncodableOpnd<long>::GetValue
                              (&((IntConstOpnd *)constIntVal_2)->super_EncodableOpnd<long>);
      constSrcInt._4_1_ = 1;
      constSrcInt._3_1_ = addrSrcBool != (AddrOpnd *)0x0;
    }
    else {
      bVar3 = IR::Opnd::IsAddrOpnd(srcInt);
      if (bVar3) {
        pAStack_c0 = IR::Opnd::AsAddrOpnd((Opnd *)local_78);
        if (((pAStack_c0 == (AddrOpnd *)0x0) || (bVar3 = IR::AddrOpnd::IsVar(pAStack_c0), !bVar3))
           || (bVar3 = Js::TaggedInt::Is(pAStack_c0->m_address), !bVar3)) {
          return false;
        }
        local_c4 = Js::TaggedInt::ToInt32(pAStack_c0->m_address);
        constSrcInt._4_1_ = 1;
        constSrcInt._3_1_ = local_c4 != 0;
      }
      else {
        bVar3 = IR::Opnd::IsConstOpnd(srcInt);
        if (bVar3) {
          return false;
        }
      }
    }
    local_c6.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         IR::Opnd::GetValueType((Opnd *)local_78);
    bVar3 = ValueType::IsTaggedInt((ValueType *)&local_c6.field_0);
    local_12f = false;
    if (bVar3) {
      local_c8.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           IR::Opnd::GetValueType(srcInt);
      local_12f = ValueType::IsBoolean((ValueType *)&local_c8.field_0);
    }
    if (local_12f == false) {
      labelDone = IR::LabelInstr::New(Label,this->m_func,true);
      bVar3 = IR::Opnd::IsConstOpnd((Opnd *)local_78);
      local_130 = 0;
      if (!bVar3) {
        equalResultValue._2_2_ = IR::Opnd::GetValueType((Opnd *)local_78);
        bVar3 = ValueType::IsTaggedInt((ValueType *)((long)&equalResultValue + 2));
        local_130 = bVar3 ^ 0xff;
      }
      if ((local_130 & 1) != 0) {
        pRVar13 = IR::Opnd::AsRegOpnd((Opnd *)local_78);
        LowererMD::GenerateSmIntTest
                  (&this->m_lowererMD,&pRVar13->super_Opnd,(Instr *)pNeedHelper_local,labelDone,
                   (Instr **)0x0,false);
      }
      bVar3 = IR::Opnd::IsConstOpnd(srcInt);
      local_139 = 0;
      if (!bVar3) {
        equalResultValue._0_2_ = IR::Opnd::GetValueType(srcInt);
        bVar3 = ValueType::IsBoolean((ValueType *)&equalResultValue);
        local_139 = bVar3 ^ 0xff;
      }
      if ((local_139 & 1) != 0) {
        inequalResultValue._2_2_ = IR::Opnd::GetValueType(srcInt);
        bVar3 = ValueType::IsObject((ValueType *)((long)&inequalResultValue + 2));
        if (((bVar3 ^ 0xffU) & 1) != 0) {
          pRVar13 = IR::Opnd::AsRegOpnd(srcInt);
          LowererMD::GenerateObjectTest
                    (&this->m_lowererMD,&pRVar13->super_Opnd,(Instr *)pNeedHelper_local,labelDone,
                     false);
        }
        pRVar13 = IR::Opnd::AsRegOpnd(srcInt);
        GenerateJSBooleanTest(this,pRVar13,(Instr *)pNeedHelper_local,labelDone,false);
      }
    }
    else {
      *pbStack_28 = false;
    }
    pbVar2 = pNeedHelper_local;
    pOVar9 = srcInt;
    LVar6 = ValueFalse;
    if (((src1._4_1_ ^ 0xff) & 1) != 0) {
      LVar6 = ValueTrue;
    }
    local_2ec = ValueTrue;
    if (((src1._4_1_ ^ 0xff) & 1) != 0) {
      local_2ec = ValueFalse;
    }
    if ((src1._4_1_ & 1) == 0) {
      local_150 = labelFallthrough;
    }
    else {
      local_150 = (LabelInstr *)instrBranch;
    }
    if ((src1._4_1_ & 1) == 0) {
      local_158 = (LabelInstr *)instrBranch;
    }
    else {
      local_158 = labelFallthrough;
    }
    if ((src1._5_1_ & 1) == 0) {
      if (((constSrcInt._7_1_ & 1) == 0) || ((constSrcInt._4_1_ & 1) == 0)) {
        if (((constSrcInt._7_1_ & 1) == 0) && ((constSrcInt._4_1_ & 1) == 0)) {
          pLVar11 = IR::LabelInstr::New(Label,this->m_func,false);
          pLVar12 = IR::LabelInstr::New(Label,this->m_func,false);
          pRVar13 = IR::Opnd::AsRegOpnd((Opnd *)local_78);
          LowererMD::GenerateTaggedZeroTest
                    (&this->m_lowererMD,&pRVar13->super_Opnd,(Instr *)pNeedHelper_local,pLVar11);
          pIVar14 = IR::IntConstOpnd::New(0x1000000000001,TyVar,this->m_func,true);
          pRVar13 = IR::Opnd::AsRegOpnd((Opnd *)local_78);
          local_1c8 = pLVar12;
          if ((src1._6_1_ & 1) != 0) {
            local_1c8 = local_158;
          }
          InsertCompareBranch(this,&pIVar14->super_Opnd,&pRVar13->super_Opnd,BrNeq_A,local_1c8,
                              (Instr *)pNeedHelper_local,true);
          pbVar2 = pNeedHelper_local;
          pOVar9 = srcInt;
          if ((src1._6_1_ & 1) == 0) {
            if ((src1._4_1_ & 1) == 0) {
              pOVar9 = IR::Instr::GetDst((Instr *)pNeedHelper_local);
              InsertMove(pOVar9,srcInt,(Instr *)pNeedHelper_local,true);
            }
            else {
              pOVar10 = IR::Instr::GetDst((Instr *)pNeedHelper_local);
              GenerateBooleanNegate(this,(Instr *)pbVar2,pOVar9,pOVar10);
            }
            pbVar2 = pNeedHelper_local;
            pBVar8 = IR::BranchInstr::New(JMP,(LabelInstr *)srcBool,this->m_func);
            IR::Instr::InsertBefore((Instr *)pbVar2,&pBVar8->super_Instr);
            IR::Instr::InsertBefore((Instr *)pNeedHelper_local,&pLVar11->super_Instr);
            pbVar2 = pNeedHelper_local;
            pOVar9 = srcInt;
            if ((src1._4_1_ & 1) == 0) {
              pOVar10 = IR::Instr::GetDst((Instr *)pNeedHelper_local);
              GenerateBooleanNegate(this,(Instr *)pbVar2,pOVar9,pOVar10);
            }
            else {
              pOVar9 = IR::Instr::GetDst((Instr *)pNeedHelper_local);
              InsertMove(pOVar9,srcInt,(Instr *)pNeedHelper_local,true);
            }
            pbVar2 = pNeedHelper_local;
            pBVar8 = IR::BranchInstr::New(JMP,(LabelInstr *)srcBool,this->m_func);
            IR::Instr::InsertBefore((Instr *)pbVar2,&pBVar8->super_Instr);
            IR::Instr::InsertBefore((Instr *)pNeedHelper_local,&pLVar12->super_Instr);
            pOVar9 = IR::Instr::GetDst((Instr *)pNeedHelper_local);
            pOVar10 = LoadLibraryValueOpnd(this,(Instr *)pNeedHelper_local,local_2ec);
            InsertMove(pOVar9,pOVar10,(Instr *)pNeedHelper_local,true);
            pbVar2 = pNeedHelper_local;
            pBVar8 = IR::BranchInstr::New(JMP,(LabelInstr *)srcBool,this->m_func);
            IR::Instr::InsertBefore((Instr *)pbVar2,&pBVar8->super_Instr);
          }
          else {
            pOVar10 = LoadLibraryValueOpnd(this,(Instr *)pNeedHelper_local,ValueTrue);
            InsertCompareBranch(this,pOVar9,pOVar10,*(OpCode *)(pNeedHelper_local + 0x30),
                                labelFallthrough,(Instr *)pNeedHelper_local,false);
            pbVar2 = pNeedHelper_local;
            pBVar8 = IR::BranchInstr::New(JMP,(LabelInstr *)instrBranch,this->m_func);
            IR::Instr::InsertBefore((Instr *)pbVar2,&pBVar8->super_Instr);
            IR::Instr::InsertBefore((Instr *)pNeedHelper_local,&pLVar11->super_Instr);
            pOVar9 = srcInt;
            pOVar10 = LoadLibraryValueOpnd(this,(Instr *)pNeedHelper_local,ValueFalse);
            InsertCompareBranch(this,pOVar9,pOVar10,*(OpCode *)(pNeedHelper_local + 0x30),
                                labelFallthrough,(Instr *)pNeedHelper_local,false);
            pbVar2 = pNeedHelper_local;
            pBVar8 = IR::BranchInstr::New(JMP,(LabelInstr *)instrBranch,this->m_func);
            IR::Instr::InsertBefore((Instr *)pbVar2,&pBVar8->super_Instr);
          }
        }
        else if ((constSrcInt._7_1_ & 1) == 0) {
          if ((constSrcInt._4_1_ & 1) != 0) {
            if ((src1._6_1_ & 1) == 0) {
              pLVar11 = IR::LabelInstr::New(Label,this->m_func,false);
              pLVar12 = IR::LabelInstr::New(Label,this->m_func,false);
              pRVar13 = IR::Opnd::AsRegOpnd((Opnd *)local_78);
              LowererMD::GenerateTaggedZeroTest
                        (&this->m_lowererMD,&pRVar13->super_Opnd,(Instr *)pNeedHelper_local,pLVar12)
              ;
              if ((constSrcInt._3_1_ & 1) != 0) {
                pIVar14 = IR::IntConstOpnd::New(0x1000000000001,TyVar,this->m_func,false);
                pRVar13 = IR::Opnd::AsRegOpnd((Opnd *)local_78);
                InsertCompareBranch(this,&pIVar14->super_Opnd,&pRVar13->super_Opnd,BrNeq_A,pLVar12,
                                    (Instr *)pNeedHelper_local,true);
              }
              IR::Instr::InsertBefore((Instr *)pNeedHelper_local,&pLVar11->super_Instr);
              pOVar9 = IR::Instr::GetDst((Instr *)pNeedHelper_local);
              local_2cc = local_2ec;
              if ((constSrcInt._3_1_ & 1) != 0) {
                local_2cc = LVar6;
              }
              pOVar10 = LoadLibraryValueOpnd(this,(Instr *)pNeedHelper_local,local_2cc);
              InsertMove(pOVar9,pOVar10,(Instr *)pNeedHelper_local,true);
              pbVar2 = pNeedHelper_local;
              pBVar8 = IR::BranchInstr::New(JMP,(LabelInstr *)srcBool,this->m_func);
              IR::Instr::InsertBefore((Instr *)pbVar2,&pBVar8->super_Instr);
              IR::Instr::InsertBefore((Instr *)pNeedHelper_local,&pLVar12->super_Instr);
              pOVar9 = IR::Instr::GetDst((Instr *)pNeedHelper_local);
              if ((constSrcInt._3_1_ & 1) == 0) {
                local_2ec = LVar6;
              }
              pOVar10 = LoadLibraryValueOpnd(this,(Instr *)pNeedHelper_local,local_2ec);
              InsertMove(pOVar9,pOVar10,(Instr *)pNeedHelper_local,true);
              pbVar2 = pNeedHelper_local;
              pBVar8 = IR::BranchInstr::New(JMP,(LabelInstr *)srcBool,this->m_func);
              IR::Instr::InsertBefore((Instr *)pbVar2,&pBVar8->super_Instr);
            }
            else {
              pRVar13 = IR::Opnd::AsRegOpnd((Opnd *)local_78);
              if ((constSrcInt._3_1_ & 1) == 0) {
                local_288 = local_150;
              }
              else {
                local_288 = local_158;
              }
              LowererMD::GenerateTaggedZeroTest
                        (&this->m_lowererMD,&pRVar13->super_Opnd,(Instr *)pNeedHelper_local,
                         local_288);
              if ((constSrcInt._3_1_ & 1) != 0) {
                pIVar14 = IR::IntConstOpnd::New(0x1000000000001,TyVar,this->m_func,false);
                pRVar13 = IR::Opnd::AsRegOpnd((Opnd *)local_78);
                InsertCompareBranch(this,&pIVar14->super_Opnd,&pRVar13->super_Opnd,BrNeq_A,local_158
                                    ,(Instr *)pNeedHelper_local,true);
              }
              pbVar2 = pNeedHelper_local;
              if ((constSrcInt._3_1_ & 1) == 0) {
                local_2a8 = local_158;
              }
              else {
                local_2a8 = local_150;
              }
              pBVar8 = IR::BranchInstr::New(JMP,local_2a8,this->m_func);
              IR::Instr::InsertBefore((Instr *)pbVar2,&pBVar8->super_Instr);
            }
          }
        }
        else if ((src1._6_1_ & 1) == 0) {
          if ((constSrcInt._5_1_ & 1) == 0) {
            pOVar9 = IR::Instr::GetDst((Instr *)pNeedHelper_local);
            pOVar10 = LoadLibraryValueOpnd(this,(Instr *)pNeedHelper_local,local_2ec);
            InsertMove(pOVar9,pOVar10,(Instr *)pNeedHelper_local,true);
            pbVar2 = pNeedHelper_local;
            pBVar8 = IR::BranchInstr::New(JMP,(LabelInstr *)srcBool,this->m_func);
            IR::Instr::InsertBefore((Instr *)pbVar2,&pBVar8->super_Instr);
          }
          else {
            if ((src1._4_1_ & 1) == (constSrcInt._6_1_ & 1)) {
              pOVar10 = IR::Instr::GetDst((Instr *)pNeedHelper_local);
              GenerateBooleanNegate(this,(Instr *)pbVar2,pOVar9,pOVar10);
            }
            else {
              pOVar9 = IR::Instr::GetDst((Instr *)pNeedHelper_local);
              InsertMove(pOVar9,srcInt,(Instr *)pNeedHelper_local,true);
            }
            pbVar2 = pNeedHelper_local;
            pBVar8 = IR::BranchInstr::New(JMP,(LabelInstr *)srcBool,this->m_func);
            IR::Instr::InsertBefore((Instr *)pbVar2,&pBVar8->super_Instr);
          }
        }
        else if ((constSrcInt._5_1_ & 1) == 0) {
          pBVar8 = IR::BranchInstr::New(JMP,local_158,this->m_func);
          IR::Instr::InsertBefore((Instr *)pbVar2,&pBVar8->super_Instr);
          local_150->field_0x78 = local_150->field_0x78 & 0xdf | 0x20;
        }
        else {
          LVar6 = ValueFalse;
          if ((constSrcInt._6_1_ & 1) != 0) {
            LVar6 = ValueTrue;
          }
          pOVar10 = LoadLibraryValueOpnd(this,(Instr *)pNeedHelper_local,LVar6);
          InsertCompareBranch(this,pOVar9,pOVar10,*(OpCode *)(pNeedHelper_local + 0x30),
                              labelFallthrough,(Instr *)pNeedHelper_local,false);
          pbVar2 = pNeedHelper_local;
          pBVar8 = IR::BranchInstr::New(JMP,(LabelInstr *)instrBranch,this->m_func);
          IR::Instr::InsertBefore((Instr *)pbVar2,&pBVar8->super_Instr);
        }
      }
      else {
        bVar3 = (constSrcInt._6_1_ & 1) != (constSrcInt._3_1_ & 1);
        if ((src1._6_1_ & 1) == 0) {
          pOVar9 = IR::Instr::GetDst((Instr *)pNeedHelper_local);
          local_19c = local_2ec;
          if ((!bVar3) && ((constSrcInt._5_1_ & 1) != 0)) {
            local_19c = LVar6;
          }
          pOVar10 = LoadLibraryValueOpnd(this,(Instr *)pNeedHelper_local,local_19c);
          InsertMove(pOVar9,pOVar10,(Instr *)pNeedHelper_local,true);
          pbVar2 = pNeedHelper_local;
          pBVar8 = IR::BranchInstr::New(JMP,(LabelInstr *)srcBool,this->m_func);
          IR::Instr::InsertBefore((Instr *)pbVar2,&pBVar8->super_Instr);
        }
        else {
          if (pNeedHelper_local == (bool *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x5cb0,"(instr)","instr");
            if (!bVar4) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          pbVar2 = pNeedHelper_local;
          if ((bVar3) || ((constSrcInt._5_1_ & 1) == 0)) {
            local_178 = local_158;
          }
          else {
            local_178 = local_150;
          }
          pBVar8 = IR::BranchInstr::New(JMP,local_178,this->m_func);
          IR::Instr::InsertBefore((Instr *)pbVar2,&pBVar8->super_Instr);
          if ((bVar3) || ((constSrcInt._5_1_ & 1) == 0)) {
            local_188 = local_150;
          }
          else {
            local_188 = local_158;
          }
          local_188->field_0x78 = local_188->field_0x78 & 0xdf | 0x20;
        }
      }
    }
    else if ((src1._6_1_ & 1) == 0) {
      pOVar9 = IR::Instr::GetDst((Instr *)pNeedHelper_local);
      pOVar10 = LoadLibraryValueOpnd(this,(Instr *)pNeedHelper_local,local_2ec);
      InsertMove(pOVar9,pOVar10,(Instr *)pNeedHelper_local,true);
      pbVar2 = pNeedHelper_local;
      pBVar8 = IR::BranchInstr::New(JMP,(LabelInstr *)srcBool,this->m_func);
      IR::Instr::InsertBefore((Instr *)pbVar2,&pBVar8->super_Instr);
    }
    else {
      pBVar8 = IR::BranchInstr::New(JMP,local_158,this->m_func);
      IR::Instr::InsertBefore((Instr *)pbVar2,&pBVar8->super_Instr);
      local_150->field_0x78 = local_150->field_0x78 & 0xdf | 0x20;
    }
    if ((*pbStack_28 & 1U) != 0) {
      IR::Instr::InsertBefore((Instr *)pNeedHelper_local,&labelDone->super_Instr);
    }
    return true;
  }
  return false;
}

Assistant:

bool Lowerer::GenerateFastEqBoolInt(IR::Instr * instr, bool *pNeedHelper, bool isInHelper)
{
    Assert(instr);

    // There's a total of 8 modes for this function, based on these inferred flags
    bool isBranchNotCompare = instr->IsBranchInstr();
    bool isStrict = false;
    bool isNegOp = false;

    switch (instr->m_opcode)
    {
    case Js::OpCode::BrSrEq_A:
    case Js::OpCode::BrSrNotNeq_A:
    case Js::OpCode::BrSrNeq_A:
    case Js::OpCode::BrSrNotEq_A:
    case Js::OpCode::CmSrEq_A:
    case Js::OpCode::CmSrNeq_A:
        isStrict = true;
        break;
    default:
        break;
    }
    switch (instr->m_opcode)
    {
    case Js::OpCode::BrSrEq_A:
    case Js::OpCode::BrSrNotNeq_A:
    case Js::OpCode::CmSrEq_A:
    case Js::OpCode::BrEq_A:
    case Js::OpCode::BrNotNeq_A:
    case Js::OpCode::CmEq_A:
        isNegOp = false;
        break;
    case Js::OpCode::BrSrNeq_A:
    case Js::OpCode::BrSrNotEq_A:
    case Js::OpCode::CmSrNeq_A:
    case Js::OpCode::BrNeq_A:
    case Js::OpCode::BrNotEq_A:
    case Js::OpCode::CmNeq_A:
        isNegOp = true;
        break;
    default:
        // This opcode is not one of the ones that should be handled here.
        return false;
        break;
    }

    IR::Opnd *src1 = instr->GetSrc1();
    IR::Opnd *src2 = instr->GetSrc2();

    // The instrucions given to this _should_ all be 2-arg.
    Assert(src1 && src2);
    if (!(src1 && src2))
    {
        return false;
    }

    // If it's a branch instruction, we'll want these to be defined
    //IR::BranchInstr *instrBranch = nullptr;
    IR::LabelInstr *targetInstr = nullptr;
    IR::LabelInstr *labelFallthrough = nullptr;

    if (isBranchNotCompare)
    {
        IR::BranchInstr * instrBranch = instr->AsBranchInstr();
        targetInstr = instrBranch->GetTarget();
        labelFallthrough = instrBranch->GetOrCreateContinueLabel(isInHelper);
    }

    // Assume we need the helper until we can show otherwise.
    *pNeedHelper = true;
    // If we don't know the final types well enough at JIT time, a helper block to set
    // the inputs to the correct types will be needed.
    IR::LabelInstr *labelHelper = nullptr;
    // If we're doing a compare and can handle it early, then we want to skip the helper
    IR::LabelInstr *labelDone = instr->GetOrCreateContinueLabel(isInHelper);

    // Normallize for orderings
    IR::Opnd *srcBool = nullptr;
    IR::Opnd *srcInt = nullptr;
    if (src1->GetValueType().IsLikelyBoolean() && src2->GetValueType().IsLikelyTaggedInt())
    {
        srcBool = src1;
        srcInt = src2;
    }
    else if (src1->GetValueType().IsLikelyTaggedInt() && src2->GetValueType().IsLikelyBoolean())
    {
        srcInt = src1;
        srcBool = src2;
    }
    else
    {
        return false;
    }

    // If either instruction is constant, we can simplify the check. If both are constant, we can eliminate it
    bool srcIntConst = false;
    bool srcIntConstVal = false;
    // If we're comparing with a number that is not 0 or 1, then the two are inequal by default
    bool srcIntIsBoolable = false;
    bool srcBoolConst = false;
    bool srcBoolConstVal = false;
    if (srcInt->IsIntConstOpnd())
    {
        IR::IntConstOpnd * constSrcInt = srcInt->AsIntConstOpnd();
        IntConstType constIntVal = constSrcInt->GetValue();
        srcIntConst = true;
        if (constIntVal == 0)
        {
            srcIntConstVal = false;
            srcIntIsBoolable = true;
        }
        else if (constIntVal == 1)
        {
            srcIntConstVal = true;
            srcIntIsBoolable = true;
        }
    }
    else if (srcInt->IsAddrOpnd())
    {
        IR::AddrOpnd * addrSrcInt = srcInt->AsAddrOpnd();
        if (!(addrSrcInt && addrSrcInt->IsVar() && Js::TaggedInt::Is(addrSrcInt->m_address)))
        {
            return false;
        }
        int32 constIntVal = Js::TaggedInt::ToInt32(addrSrcInt->m_address);
        srcIntConst = true;
        if (constIntVal == 0)
        {
            srcIntConstVal = false;
            srcIntIsBoolable = true;
        }
        else if (constIntVal == 1)
        {
            srcIntConstVal = true;
            srcIntIsBoolable = true;
        }
    }
    else if (srcInt->IsConstOpnd())
    {
        // Not handled yet
        return false;
    }
    if (srcBool->IsIntConstOpnd())
    {
        IR::IntConstOpnd * constSrcBool = srcBool->AsIntConstOpnd();
        IntConstType constIntVal = constSrcBool->GetValue();
        srcBoolConst = true;
        srcBoolConstVal = constIntVal != 0;
    }
    else if (srcBool->IsAddrOpnd())
    {
        IR::AddrOpnd * addrSrcBool = srcInt->AsAddrOpnd();
        if (!(addrSrcBool && addrSrcBool->IsVar() && Js::TaggedInt::Is(addrSrcBool->m_address)))
        {
            return false;
        }
        int32 value = Js::TaggedInt::ToInt32(addrSrcBool->m_address);
        srcBoolConst = true;
        srcBoolConstVal = value != 0;
    }
    else if (srcBool->IsConstOpnd())
    {
        // Not handled yet
        return false;
    }

    // Do these checks here, since that way we avoid emitting instructions before exiting earlier
    if (srcInt->GetValueType().IsTaggedInt() && srcBool->GetValueType().IsBoolean()) {
        // ok, we know the types, so no helper needed
        *pNeedHelper = false;
    }
    else
    {
        labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
        // check the types and jump to the helper if incorrect
        if (!srcInt->IsConstOpnd() && !srcInt->GetValueType().IsTaggedInt())
        {
            this->m_lowererMD.GenerateSmIntTest(srcInt->AsRegOpnd(), instr, labelHelper);
        }
        if (!srcBool->IsConstOpnd() && !srcBool->GetValueType().IsBoolean())
        {
            if (!srcBool->GetValueType().IsObject())
            {
                this->m_lowererMD.GenerateObjectTest(srcBool->AsRegOpnd(), instr, labelHelper, false);
            }
            GenerateJSBooleanTest(srcBool->AsRegOpnd(), instr, labelHelper, false);
        }
    }

    // At this point, we know both which operand is an integer and which is a boolean,
    // whether either operand is constant, and what the constant true/false values are
    // for any constant operands. This should allow us to emit some decent code.

    LibraryValue equalResultValue = !isNegOp ? LibraryValue::ValueTrue : LibraryValue::ValueFalse;
    LibraryValue inequalResultValue = !isNegOp ? LibraryValue::ValueFalse : LibraryValue::ValueTrue;
    IR::LabelInstr *equalResultTarget = !isNegOp ? targetInstr : labelFallthrough;
    IR::LabelInstr *inequalResultTarget = !isNegOp ? labelFallthrough : targetInstr;

    // For the Sr instructions, we now know that the types are different, so we can immediately
    // decide what the result will be.
    if (isStrict)
    {
        if (isBranchNotCompare)
        {
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, inequalResultTarget, this->m_func));
#if DBG
            // Since we're not making a non-helper path to one of the branches, we need to tell
            // DbCheckPostLower that we are going to have a non-helper label without non-helper
            // branches.
            // Note: this following line isn't good practice in general
            equalResultTarget->m_noHelperAssert = true;
#endif
        }
        else
        {
            Lowerer::InsertMove(instr->GetDst(), this->LoadLibraryValueOpnd(instr, inequalResultValue), instr);
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func));
        }
    }
    // Now that we've checked the types, we can lower some instructions to quickly do the check
    // in the case that it's not a type-strict strict equality/inequality check.
    else if (srcIntConst && srcBoolConst)
    {
        // If both arguments are constant, we can statically determine the result.
        bool sameVal = srcIntConstVal == srcBoolConstVal;
        if (isBranchNotCompare)
        {
            // For constant branches, branch to the target
            Assert(instr);
            IR::LabelInstr * target = sameVal && srcIntIsBoolable ? equalResultTarget : inequalResultTarget;
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, target, this->m_func));
#if DBG
            // Since we're not making a non-helper path to one of the branches, we need to tell
            // DbCheckPostLower that we are going to have a non-helper label without non-helper
            // branches.
            // Note: this following line isn't good practice in general
            (sameVal && srcIntIsBoolable ? inequalResultTarget : equalResultTarget)->m_noHelperAssert = true;
#endif
        }
        else
        {
            // For constant compares, load the constant result
            Lowerer::InsertMove(instr->GetDst(), this->LoadLibraryValueOpnd(instr, sameVal && srcIntIsBoolable ? equalResultValue : inequalResultValue), instr);
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func));
        }
    }
    else if (!srcIntConst && !srcBoolConst)
    {
        // If neither is constant, we can still do a bit better than loading the helper
        IR::LabelInstr * firstFalse = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
        IR::LabelInstr * forceInequal = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
        // We branch based on the zero-ness of the integer argument to two checks against the boolean argument
        this->m_lowererMD.GenerateTaggedZeroTest(srcInt->AsRegOpnd(), instr, firstFalse);
        // If it's not zero, then it's either 1, in which case it's true, or it's something else, in which
        // case the two will compare as inequal
        InsertCompareBranch(
            IR::IntConstOpnd::New((((IntConstType)1) << Js::VarTag_Shift) + Js::AtomTag, IRType::TyVar, this->m_func, true),
            srcInt->AsRegOpnd(),
            Js::OpCode::BrNeq_A,
            isBranchNotCompare ? inequalResultTarget : forceInequal, // in the case of branching, we can go straight to the inequal target; for compares, we need to load the value
            instr,
            true);
        if (isBranchNotCompare)
        {
            // if the int evaluates to 1 (true)
            InsertCompareBranch(
                srcBool,
                LoadLibraryValueOpnd(instr, LibraryValue::ValueTrue),
                instr->m_opcode,
                targetInstr,
                instr);
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelFallthrough, this->m_func));

            // if the int evaluates to 0 (false)
            instr->InsertBefore(firstFalse);
            InsertCompareBranch(
                srcBool,
                LoadLibraryValueOpnd(instr, LibraryValue::ValueFalse),
                instr->m_opcode,
                targetInstr,
                instr);
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelFallthrough, this->m_func));
        }
        else
        {
            // the int resolves to 1 (true)
            // Load either the bool or its complement into the dst reg, depending on the opcode
            if (isNegOp)
            {
                GenerateBooleanNegate(instr, srcBool, instr->GetDst());
            }
            else
            {
                this->InsertMove(instr->GetDst(), srcBool, instr);
            }
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func));

            // the int resolves to 0 (false)
            // Handle the complement case
            instr->InsertBefore(firstFalse);
            if (!isNegOp)
            {
                GenerateBooleanNegate(instr, srcBool, instr->GetDst());
            }
            else
            {
                this->InsertMove(instr->GetDst(), srcBool, instr);
            }
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func));

            // the int resolves to something other than 0 or 1 (inequal to a bool)
            instr->InsertBefore(forceInequal);
            Lowerer::InsertMove(instr->GetDst(), this->LoadLibraryValueOpnd(instr, inequalResultValue), instr);
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func));
        }
    }
    else if (srcIntConst)
    {
        if (isBranchNotCompare)
        {
            if (srcIntIsBoolable)
            {
                LibraryValue intval = srcIntConstVal ? LibraryValue::ValueTrue : LibraryValue::ValueFalse;
                InsertCompareBranch(
                    srcBool,
                    LoadLibraryValueOpnd(instr, intval),
                    instr->m_opcode,
                    targetInstr,
                    instr);
                instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelFallthrough, this->m_func));
            }
            else
            {
                // Since a constant int that isn't 0 or 1 will always be inequal to bools, just jump to the inequal result
                instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, inequalResultTarget, this->m_func));
#if DBG
                // Since we're not making a non-helper path to one of the branches, we need to tell
                // DbCheckPostLower that we are going to have a non-helper label without non-helper
                // branches.
                // Note: this following line isn't good practice in general
                equalResultTarget->m_noHelperAssert = true;
#endif
            }
        }
        else
        {
            if (srcIntIsBoolable)
            {
                bool directPassthrough = isNegOp != srcIntConstVal;
                if (directPassthrough)
                {
                    // If this case is hit, the result value is the same as the value in srcBool
                    this->InsertMove(instr->GetDst(), srcBool, instr);
                }
                else
                {
                    // Otherwise, the result value is the negation of the value in srcBool
                    GenerateBooleanNegate(instr, srcBool, instr->GetDst());
                }
                instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func));
            }
            else
            {
                Lowerer::InsertMove(instr->GetDst(), this->LoadLibraryValueOpnd(instr, inequalResultValue), instr);
                instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func));
            }
        }
    }
    else if (srcBoolConst)
    {
        if (isBranchNotCompare)
        {
            this->m_lowererMD.GenerateTaggedZeroTest(srcInt->AsRegOpnd(), instr, srcBoolConstVal ? inequalResultTarget : equalResultTarget);
            if (srcBoolConstVal)
            {
                // If it's not zero, then it's either 1, in which case it's true, or it's something else, in which
                // case we have an issue.
                InsertCompareBranch(IR::IntConstOpnd::New((((IntConstType)1) << Js::VarTag_Shift) + Js::AtomTag, IRType::TyVar, this->m_func), srcInt->AsRegOpnd(), Js::OpCode::BrNeq_A, inequalResultTarget, instr, true);
            }
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, srcBoolConstVal ? equalResultTarget : inequalResultTarget, this->m_func));
        }
        else
        {
            IR::LabelInstr* isNonZero = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
            IR::LabelInstr* isZero = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
            this->m_lowererMD.GenerateTaggedZeroTest(srcInt->AsRegOpnd(), instr, isZero);
            if (srcBoolConstVal)
            {
                // If it's not zero, then it's either 1, in which case it's true, or it's something else, in which
                // case we have an issue.
                InsertCompareBranch(IR::IntConstOpnd::New((((IntConstType)1) << Js::VarTag_Shift) + Js::AtomTag, IRType::TyVar, this->m_func), srcInt->AsRegOpnd(), Js::OpCode::BrNeq_A, isZero, instr, true);
            }
            instr->InsertBefore(isNonZero);
            Lowerer::InsertMove(instr->GetDst(), this->LoadLibraryValueOpnd(instr, srcBoolConstVal ? equalResultValue : inequalResultValue), instr);
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func));
            instr->InsertBefore(isZero);
            Lowerer::InsertMove(instr->GetDst(), this->LoadLibraryValueOpnd(instr, !srcBoolConstVal ? equalResultValue : inequalResultValue), instr);
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func));
        }
    }
    if (*pNeedHelper)
    {
        instr->InsertBefore(labelHelper);
    }
    return true;
}